

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhinull.cpp
# Opt level: O2

bool __thiscall QNullRenderBuffer::create(QNullRenderBuffer *this)

{
  if (this->valid == true) {
    (*(this->super_QRhiRenderBuffer).super_QRhiResource._vptr_QRhiResource[3])(this);
  }
  this->valid = true;
  this->generation = this->generation + 1;
  QRhiImplementation::registerResource
            ((this->super_QRhiRenderBuffer).super_QRhiResource.m_rhi,(QRhiResource *)this,true);
  return true;
}

Assistant:

bool QNullRenderBuffer::create()
{
    if (valid)
        destroy();

    valid = true;
    generation += 1;

    QRHI_RES_RHI(QRhiNull);
    rhiD->registerResource(this);

    return true;
}